

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndiciRandom.cpp
# Opt level: O0

void __thiscall
IndiciRandom::generaIndici
          (IndiciRandom *this,unsigned_short *risultato,unsigned_short nIndiciGenerati)

{
  unsigned_short uVar1;
  int iVar2;
  ushort uVar3;
  int local_24;
  int k;
  unsigned_short dim;
  unsigned_short tmp;
  unsigned_short ran;
  unsigned_short nIndiciGenerati_local;
  unsigned_short *risultato_local;
  IndiciRandom *this_local;
  
  if (nIndiciGenerati <= this->dimensione) {
    for (local_24 = 0; local_24 < (int)(uint)nIndiciGenerati; local_24 = local_24 + 1) {
      uVar3 = (this->dimensione - 1) - (short)local_24;
      iVar2 = Random::randIntU(this->random,0,(uint)uVar3);
      uVar1 = this->vettoreIndici[(ushort)iVar2];
      this->vettoreIndici[(ushort)iVar2] = this->vettoreIndici[uVar3];
      this->vettoreIndici[uVar3] = uVar1;
      risultato[local_24] = this->vettoreIndici[uVar3];
    }
  }
  return;
}

Assistant:

void IndiciRandom::generaIndici(unsigned short risultato[], unsigned short nIndiciGenerati) {
	if (nIndiciGenerati > dimensione) return;

	unsigned short ran, tmp, dim;

	for (int k = 0; k < nIndiciGenerati; k++) {
		dim = dimensione - 1 - k;
		ran = random->randIntU(0, dim);
		tmp = vettoreIndici[ran];
		vettoreIndici[ran] = vettoreIndici[dim];
		vettoreIndici[dim] = tmp;

		risultato[k] = vettoreIndici[dim];
	}
}